

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O3

void armci_stride_info_next(stride_info_t *sinfo)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  
  if (sinfo == (stride_info_t *)0x0) {
    __assert_fail("sinfo!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                  ,0x60,"void armci_stride_info_next(stride_info_t *)");
  }
  if (sinfo->size <= sinfo->pos) {
    __assert_fail("sinfo->pos <sinfo->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                  ,0x61,"void armci_stride_info_next(stride_info_t *)");
  }
  sinfo->pos = sinfo->pos + 1;
  uVar4 = sinfo->stride_levels;
  if (0 < (int)uVar4) {
    iVar1 = sinfo->itr[0] + 1;
    sinfo->itr[0] = iVar1;
    uVar2 = 1;
    if (uVar4 != 1) {
      uVar3 = (ulong)(uVar4 - 1);
      uVar2 = 0;
      do {
        if (iVar1 != sinfo->seg_count[uVar2 + 1]) {
          uVar3 = uVar2 & 0xffffffff;
          uVar4 = (int)uVar2 + 1;
          break;
        }
        sinfo->itr[uVar2] = 0;
        iVar1 = sinfo->itr[uVar2 + 1] + 1;
        sinfo->itr[uVar2 + 1] = iVar1;
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
      iVar1 = sinfo->itr[uVar3];
      uVar2 = (ulong)uVar4;
    }
    if (sinfo->seg_count[uVar2] < iVar1) {
      __assert_fail("sinfo->itr[i] <= sinfo->seg_count[i+1]",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                    ,0x69,"void armci_stride_info_next(stride_info_t *)");
    }
  }
  return;
}

Assistant:

void armci_stride_info_next(stride_info_t *sinfo) {
  int i;
  assert(sinfo!=NULL);
  assert(sinfo->pos <sinfo->size);
  sinfo->pos += 1;
  if(sinfo->stride_levels>0) {
    sinfo->itr[0] += 1;
    for(i=0; i<sinfo->stride_levels-1 && sinfo->itr[i]==sinfo->seg_count[i+1]; i++) {
      sinfo->itr[i] = 0;
      sinfo->itr[i+1] += 1;
    }
    assert(sinfo->itr[i] <= sinfo->seg_count[i+1]);
  }
}